

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O3

string * __thiscall
LinearRegression::typeToStr_abi_cxx11_(string *__return_storage_ptr__,LinearRegression *this,Type t)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(t) {
  case Integer:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "int";
    pcVar1 = "";
    break;
  case Double:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "double";
    pcVar1 = "";
    break;
  case Short:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "short";
    pcVar1 = "";
    break;
  case U_Integer:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "size_t";
    pcVar1 = "";
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"This type does not exist \n");
    exit(1);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string LinearRegression::typeToStr(Type t)
{
    switch(t)
    {
    case Type::Integer : return "int";
    case Type::Double : return "double";            
    case Type::Short : return "short";
    case Type::U_Integer : return "size_t";
    default :
        ERROR("This type does not exist \n");
        exit(1);
    }
}